

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O3

wstring * lzstring::to_wstring(wstring *__return_storage_ptr__,string *src)

{
  pointer pwVar1;
  size_t sVar2;
  vector<wchar_t,_std::allocator<wchar_t>_> tmp;
  allocator_type local_31;
  vector<wchar_t,_std::allocator<wchar_t>_> local_30;
  
  setlocale(0,"zh_CN");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sVar2 = mbstowcs((wchar_t *)0x0,(src->_M_dataplus)._M_p,0);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(&local_30,sVar2 + 1,&local_31);
  mbstowcs(local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start,(src->_M_dataplus)._M_p,src->_M_string_length);
  pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::wstring::
  _M_replace_dispatch<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>>
            ((wstring *)__return_storage_ptr__,pwVar1,
             pwVar1 + __return_storage_ptr__->_M_string_length,
             local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  if (local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data
      ._M_start != (wchar_t *)0x0) {
    operator_delete(local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_wstring(std::string const &src)
{
    //   std::setlocale(LC_CTYPE, "");
    std::setlocale(LC_CTYPE, "zh_CN");

    std::wstring dest;
    size_t const wcs_len = mbstowcs(NULL, src.c_str(), 0);
    std::vector<wchar_t> tmp(wcs_len + 1);
    mbstowcs(&tmp[0], src.c_str(), src.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}